

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O1

void icu_63::number::impl::blueprint_helpers::parseNumberingSystemOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *status)

{
  int32_t textLength;
  UErrorCode UVar1;
  NumberingSystem *ns;
  UErrorCode conversionStatus;
  CharString buffer;
  UErrorCode local_fc;
  ConstChar16Ptr local_f8;
  char16_t *local_f0;
  UnicodeString local_e0;
  CharString local_a0;
  UnicodeString local_60;
  
  MaybeStackArray<char,_40>::MaybeStackArray(&local_a0.buffer);
  local_a0.len = 0;
  *local_a0.buffer.ptr = '\0';
  local_fc = U_ZERO_ERROR;
  numparse::impl::StringSegment::toTempUnicodeString(&local_e0,segment);
  if ((local_e0.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
    if ((local_e0.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
      local_e0.fUnion.fFields.fArray = (char16_t *)((long)&local_e0.fUnion + 2);
    }
  }
  else {
    local_e0.fUnion.fFields.fArray = (char16_t *)0x0;
  }
  local_f8.p_ = local_e0.fUnion.fFields.fArray;
  textLength = numparse::impl::StringSegment::length(segment);
  UnicodeString::UnicodeString(&local_60,'\0',&local_f8,textLength);
  CharString::appendInvariantChars(&local_a0,&local_60,&local_fc);
  UnicodeString::~UnicodeString(&local_60);
  local_f0 = local_f8.p_;
  UnicodeString::~UnicodeString(&local_e0);
  UVar1 = U_NUMBER_SKELETON_SYNTAX_ERROR;
  if ((local_fc == U_INVARIANT_CONVERSION_ERROR) || (UVar1 = local_fc, U_ZERO_ERROR < local_fc)) {
    *status = UVar1;
  }
  else {
    ns = NumberingSystem::createInstanceByName(local_a0.buffer.ptr,status);
    if ((ns == (NumberingSystem *)0x0) || (U_ZERO_ERROR < *status)) {
      *status = U_NUMBER_SKELETON_SYNTAX_ERROR;
    }
    else {
      SymbolsWrapper::setTo(&macros->symbols,ns);
    }
  }
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_a0.buffer);
  return;
}

Assistant:

void blueprint_helpers::parseNumberingSystemOption(const StringSegment& segment, MacroProps& macros,
                                                   UErrorCode& status) {
    // Need to do char <-> UChar conversion...
    U_ASSERT(U_SUCCESS(status));
    CharString buffer;
    SKELETON_UCHAR_TO_CHAR(buffer, segment.toTempUnicodeString(), 0, segment.length(), status);

    NumberingSystem* ns = NumberingSystem::createInstanceByName(buffer.data(), status);
    if (ns == nullptr || U_FAILURE(status)) {
        // This is a skeleton syntax error; don't bubble up the low-level NumberingSystem error
        // throw new SkeletonSyntaxException("Unknown numbering system", segment);
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return;
    }
    macros.symbols.setTo(ns);
}